

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O0

wostream * Centaurus::operator<<(wostream *os,CharClass<char> *cc)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  pointer pRVar5;
  __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
  local_30;
  __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
  local_28;
  const_iterator i;
  CharClass<char> *cc_local;
  wostream *os_local;
  
  i._M_current = (Range<char> *)cc;
  bVar1 = CharClass<char>::is_epsilon(cc);
  if (!bVar1) {
    local_28._M_current =
         (Range<char> *)
         std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::cbegin
                   ((vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *)
                    &(i._M_current)->m_start);
    std::operator<<(os,L'[');
    while( true ) {
      local_30._M_current =
           (Range<char> *)
           std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::cend
                     ((vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *)
                      &(i._M_current)->m_start);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      pRVar5 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
               ::operator->(&local_28);
      bVar2 = Range<char>::end(pRVar5);
      pRVar5 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
               ::operator->(&local_28);
      bVar3 = Range<char>::start(pRVar5);
      if ((uint)bVar2 == bVar3 + 1) {
        pRVar5 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
                 ::operator->(&local_28);
        cVar4 = Range<char>::start(pRVar5);
        printc(os,cVar4);
      }
      else {
        pRVar5 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
                 ::operator->(&local_28);
        cVar4 = Range<char>::start(pRVar5);
        printc(os,cVar4);
        std::operator<<(os,L'-');
        pRVar5 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
                 ::operator->(&local_28);
        cVar4 = Range<char>::end(pRVar5);
        printc(os,cVar4 + -1);
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::Range<char>_*,_std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>_>
      ::operator++(&local_28,0);
    }
    std::operator<<(os,L']');
  }
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const CharClass<TCHAR>& cc)
{
    if (cc.is_epsilon()) return os;

    auto i = cc.m_ranges.cbegin();

	os << L'[';
    for (; i != cc.m_ranges.cend();)
    {
        if (i->end() == i->start() + 1)
        {
            /*if (i->start() == wide_to_target<TCHAR>(L'"'))
                os << L"\\\"";
            else if (i->start() == wide_to_target<TCHAR>(L'\\'))
                os << L"\\\\";
            else
            {
                wchar_t ch = os.widen(i->start(), '@');
                os << (std::isprint(ch) ? ch : '@');
            }*/
			printc(os, i->start());
        }
        else
        {
			printc(os, i->start());
            os << L'-';
			printc(os, (TCHAR)(i->end() - 1));
        }
        i++;
    }
	os << L']';
    return os;
}